

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIEnvironment.cpp
# Opt level: O2

void __thiscall irr::gui::CGUIEnvironment::clear(CGUIEnvironment *this)

{
  undefined1 *puVar1;
  IGUIElement *pIVar2;
  int iVar3;
  undefined4 extraout_var;
  
  pIVar2 = this->Focus;
  if (pIVar2 != (IGUIElement *)0x0) {
    IReferenceCounted::drop
              ((IReferenceCounted *)
               ((pIVar2->super_IEventReceiver)._vptr_IEventReceiver[-3] +
               (long)&(pIVar2->super_IEventReceiver)._vptr_IEventReceiver));
    this->Focus = (IGUIElement *)0x0;
  }
  pIVar2 = this->Hovered;
  puVar1 = &(this->super_IGUIEnvironment).field_0x8;
  if (pIVar2 != (IGUIElement *)puVar1 && pIVar2 != (IGUIElement *)0x0) {
    IReferenceCounted::drop
              ((IReferenceCounted *)
               ((pIVar2->super_IEventReceiver)._vptr_IEventReceiver[-3] +
               (long)&(pIVar2->super_IEventReceiver)._vptr_IEventReceiver));
    this->Hovered = (IGUIElement *)0x0;
  }
  pIVar2 = this->HoveredNoSubelement;
  if (pIVar2 != (IGUIElement *)puVar1 && pIVar2 != (IGUIElement *)0x0) {
    IReferenceCounted::drop
              ((IReferenceCounted *)
               ((pIVar2->super_IEventReceiver)._vptr_IEventReceiver[-3] +
               (long)&(pIVar2->super_IEventReceiver)._vptr_IEventReceiver));
    this->HoveredNoSubelement = (IGUIElement *)0x0;
  }
  iVar3 = (*(this->super_IGUIEnvironment)._vptr_IGUIEnvironment[0x16])(this);
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x40))((long *)CONCAT44(extraout_var,iVar3));
  return;
}

Assistant:

void CGUIEnvironment::clear()
{
	// Remove the focus
	if (Focus) {
		Focus->drop();
		Focus = 0;
	}

	if (Hovered && Hovered != this) {
		Hovered->drop();
		Hovered = 0;
	}
	if (HoveredNoSubelement && HoveredNoSubelement != this) {
		HoveredNoSubelement->drop();
		HoveredNoSubelement = 0;
	}

	getRootGUIElement()->removeAllChildren();
}